

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O3

void __thiscall CClient::OnDemoPlayerMessage(CClient *this)

{
  int in_EDX;
  void *in_RSI;
  
  OnDemoPlayerMessage((CClient *)(this[-1].m_VersionInfo.m_VersionServeraddr.m_aHostname + 0x68),
                      in_RSI,in_EDX);
  return;
}

Assistant:

void CClient::OnDemoPlayerMessage(void *pData, int Size)
{
	CUnpacker Unpacker;
	Unpacker.Reset(pData, Size);

	// unpack msgid and system flag
	int Msg = Unpacker.GetInt();
	int Sys = Msg&1;
	Msg >>= 1;

	if(Unpacker.Error())
		return;

	if(!Sys)
		GameClient()->OnMessage(Msg, &Unpacker);
}